

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool google::protobuf::internal::cpp::IsGroupLike(FieldDescriptor *field)

{
  bool bVar1;
  Type TVar2;
  Descriptor *pDVar3;
  FileDescriptor *pFVar4;
  FileDescriptor *pFVar5;
  Descriptor *pDVar6;
  char *in_RCX;
  string_view sVar7;
  bool local_79;
  lts_20250127 *local_68;
  char *local_60;
  string local_58;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_38;
  string_view local_28;
  FieldDescriptor *local_18;
  FieldDescriptor *field_local;
  
  local_18 = field;
  TVar2 = FieldDescriptor::type(field);
  if (TVar2 == TYPE_GROUP) {
    local_28 = FieldDescriptor::name(local_18);
    pDVar3 = FieldDescriptor::message_type(local_18);
    sVar7 = Descriptor::name(pDVar3);
    local_68 = (lts_20250127 *)sVar7._M_len;
    local_60 = sVar7._M_str;
    sVar7._M_str = in_RCX;
    sVar7._M_len = (size_t)local_60;
    absl::lts_20250127::AsciiStrToLower_abi_cxx11_(&local_58,local_68,sVar7);
    local_38 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_58);
    bVar1 = std::operator!=(local_28,local_38);
    std::__cxx11::string::~string((string *)&local_58);
    if (bVar1) {
      field_local._7_1_ = false;
    }
    else {
      pDVar3 = FieldDescriptor::message_type(local_18);
      pFVar4 = Descriptor::file(pDVar3);
      pFVar5 = FieldDescriptor::file(local_18);
      if (pFVar4 == pFVar5) {
        bVar1 = FieldDescriptor::is_extension(local_18);
        if (bVar1) {
          pDVar3 = FieldDescriptor::message_type(local_18);
          pDVar3 = Descriptor::containing_type(pDVar3);
          pDVar6 = FieldDescriptor::extension_scope(local_18);
          local_79 = pDVar3 == pDVar6;
        }
        else {
          pDVar3 = FieldDescriptor::message_type(local_18);
          pDVar3 = Descriptor::containing_type(pDVar3);
          pDVar6 = FieldDescriptor::containing_type(local_18);
          local_79 = pDVar3 == pDVar6;
        }
        field_local._7_1_ = local_79;
      }
      else {
        field_local._7_1_ = false;
      }
    }
  }
  else {
    field_local._7_1_ = false;
  }
  return field_local._7_1_;
}

Assistant:

bool IsGroupLike(const FieldDescriptor& field) {
  // Groups are always tag-delimited, currently specified by a TYPE_GROUP type.
  if (field.type() != FieldDescriptor::TYPE_GROUP) return false;
  // Group fields always are always the lowercase type name.
  if (field.name() != absl::AsciiStrToLower(field.message_type()->name())) {
    return false;
  }

  if (field.message_type()->file() != field.file()) return false;

  // Group messages are always defined in the same scope as the field.  File
  // level extensions will compare NULL == NULL here, which is why the file
  // comparison above is necessary to ensure both come from the same file.
  return field.is_extension() ? field.message_type()->containing_type() ==
                                    field.extension_scope()
                              : field.message_type()->containing_type() ==
                                    field.containing_type();
}